

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::BufferVkImpl::BufferVkImpl
          (BufferVkImpl *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *BuffViewObjMemAllocator,RenderDeviceVkImpl *pRenderDeviceVk,
          BufferDesc *BuffDesc,BufferData *pBuffData)

{
  MEMORY_PROPERTIES *pMVar1;
  VkDeviceSize *pVVar2;
  USAGE UVar3;
  VulkanPhysicalDevice *this_00;
  VkDeviceSize VVar4;
  VkDeviceMemory memory;
  long lVar5;
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this_01;
  void *pvVar6;
  BufferData *pBVar7;
  element_type *peVar8;
  byte bVar9;
  SoftwareQueueIndex CommandQueueId;
  VkResult VVar10;
  undefined4 uVar11;
  VkPipelineStageFlags VVar12;
  RenderDeviceVkImpl *pRVar13;
  VkDeviceSize VVar14;
  VkDeviceAddress VVar15;
  ulong uVar16;
  char (*Args_1) [56];
  char (*Args_1_00) [128];
  char (*Args_1_01) [44];
  BIND_FLAGS BVar17;
  uint uVar18;
  char (*Alignment) [43];
  char (*Args_1_02) [46];
  _Base_ptr __n;
  char *pcVar19;
  uint uVar20;
  Uint64 QueueMask;
  BIND_FLAGS BVar21;
  RESOURCE_STATE RVar22;
  bool bVar23;
  string msg;
  VulkanMemoryAllocation StagingMemoryAllocation;
  VkMemoryRequirements MemReqs;
  string StagingBufferName;
  string msg_14;
  BufferWrapper StagingBuffer;
  VkBufferCreateInfo VkStaginBuffCI;
  VkMemoryRequirements StagingBufferMemReqs;
  CommandPoolWrapper CmdPool;
  uint local_24c;
  undefined1 local_248 [16];
  undefined1 auStack_238 [144];
  char (*local_1a8) [43];
  void *pvStack_1a0;
  _Base_ptr local_198;
  undefined8 uStack_190;
  byte local_188;
  byte bStack_187;
  ushort uStack_186;
  VkSharingMode VStack_184;
  uint32_t uStack_180;
  undefined4 uStack_17c;
  uint32_t *local_178;
  BufferData *local_168;
  element_type *local_160;
  element_type *local_158;
  VulkanMemoryAllocation local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  VulkanMemoryAllocation *local_120;
  RenderDeviceVkImpl *local_118;
  VkMemoryRequirements local_110;
  void **local_f8 [2];
  void *local_e8 [2];
  string local_d8;
  BufferWrapper local_b0;
  VkBufferCreateInfo local_98;
  VkMemoryRequirements local_60;
  CommandPoolWrapper local_48;
  
  BufferBase<Diligent::EngineVkImplTraits>::BufferBase
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,pRefCounters,
             BuffViewObjMemAllocator,pRenderDeviceVk,BuffDesc,false);
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>.
  super_ObjectBase<Diligent::IBufferVk>.super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
  super_IBuffer.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00aef2e0;
  this->m_DynamicOffsetAlignment = 0;
  local_158 = (element_type *)&this->m_VulkanBuffer;
  local_120 = &this->m_MemoryAllocation;
  auStack_238._136_8_ =
       &(this->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc;
  this->m_BufferMemoryAlignedOffset = 0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  local_168 = pBuffData;
  ValidateBufferInitData((BufferDesc *)auStack_238._136_8_,pBuffData);
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  local_160 = (pRenderDeviceVk->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  uVar18 = *(uint *)((long)&(this_00->m_Properties).limits + 0x1e0);
  uVar20 = 4;
  if (4 < uVar18) {
    uVar20 = uVar18;
  }
  this->m_DynamicOffsetAlignment = uVar20;
  pvStack_1a0 = (void *)0x0;
  VStack_184 = VK_SHARING_MODE_EXCLUSIVE;
  uStack_180 = 0;
  uStack_17c = 0;
  local_178 = (uint32_t *)0x0;
  local_1a8 = (char (*) [43])0xc;
  local_198 = (_Base_ptr)0x0;
  uStack_190 = (_Base_ptr)
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.Size;
  local_188 = 3;
  bStack_187 = 0;
  uStack_186 = 0;
  BVar21 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.BindFlags;
  local_118 = pRenderDeviceVk;
  if (BVar21 != BIND_NONE) {
    do {
      BVar17 = -BVar21 & BVar21;
      if (0x7f < (int)BVar17) {
        if (BVar17 == BIND_UNORDERED_ACCESS) {
          uVar18 = CONCAT22(uStack_186,CONCAT11(bStack_187,local_188));
          if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc.Mode != BUFFER_MODE_FORMATTED) goto LAB_00277374;
          uVar18 = uVar18 | 8;
LAB_00277364:
          local_188 = (byte)uVar18;
          bStack_187 = (byte)(uVar18 >> 8);
          uStack_186 = (ushort)(uVar18 >> 0x10);
          uVar18 = *(uint *)((long)&(this_00->m_Properties).limits + 0x138);
          goto LAB_00277385;
        }
        if (BVar17 == BIND_INDIRECT_DRAW_ARGS) {
          bStack_187 = bStack_187 | 1;
        }
        else {
          if (BVar17 != BIND_RAY_TRACING) goto switchD_002772e5_caseD_3;
          uVar18 = CONCAT22(uStack_186,CONCAT11(bStack_187,local_188)) | 0xa0420;
          local_188 = (byte)uVar18;
          bStack_187 = (byte)(uVar18 >> 8);
          uStack_186 = (ushort)(uVar18 >> 0x10);
        }
        goto LAB_002773e8;
      }
      switch(BVar17) {
      case BIND_VERTEX_BUFFER:
        local_188 = local_188 | 0x80;
        break;
      case BIND_INDEX_BUFFER:
        local_188 = local_188 | 0x40;
        break;
      default:
switchD_002772e5_caseD_3:
        FormatString<char[32]>((string *)local_248,(char (*) [32])"unsupported buffer binding type")
        ;
        DebugAssertionFailed
                  ((Char *)local_248._0_8_,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x97);
        if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
          operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
        }
        break;
      case BIND_UNIFORM_BUFFER:
        local_188 = local_188 | 0x10;
        uVar18 = *(uint *)((long)&(this_00->m_Properties).limits + 0x140);
        goto LAB_00277385;
      case BIND_SHADER_RESOURCE:
        uVar18 = CONCAT22(uStack_186,CONCAT11(bStack_187,local_188));
        if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Mode == BUFFER_MODE_FORMATTED) {
          uVar18 = uVar18 | 4;
          goto LAB_00277364;
        }
LAB_00277374:
        local_188 = (byte)uVar18 | 0x20;
        bStack_187 = (byte)(uVar18 >> 8);
        uStack_186 = (ushort)(uVar18 >> 0x10);
        uVar18 = *(uint *)((long)&(this_00->m_Properties).limits + 0x148);
LAB_00277385:
        if (uVar18 < this->m_DynamicOffsetAlignment) {
          uVar18 = this->m_DynamicOffsetAlignment;
        }
        this->m_DynamicOffsetAlignment = uVar18;
      }
LAB_002773e8:
      bVar23 = BVar17 != BVar21;
      BVar21 = BVar17 ^ BVar21;
    } while (bVar23);
  }
  VStack_184 = VK_SHARING_MODE_EXCLUSIVE;
  uStack_180 = 0;
  local_178 = (pointer)0x0;
  uVar16 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           .m_Desc.ImmediateContextMask;
  if ((uVar16 & uVar16 - 1) == 0) {
    local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar19 = (char *)BuffDesc;
  }
  else {
    pRVar13 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           *)this);
    RenderDeviceVkImpl::ConvertCmdQueueIdsToQueueFamilies
              (&local_138,pRVar13,
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.ImmediateContextMask);
    pcVar19 = (char *)BuffDesc;
  }
  peVar8 = local_160;
  uVar16 = (long)local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (1 < uVar16) {
    VStack_184 = VK_SHARING_MODE_CONCURRENT;
    uStack_180 = (uint32_t)uVar16;
    local_178 = local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  bVar9 = 1;
  if ((CONCAT22(uStack_186,CONCAT11(bStack_187,local_188)) & 0x2000c) == 0) {
    if ((local_188 & 0x20) == 0) {
      bVar9 = 0;
    }
    else {
      bVar9 = (byte)(char)(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          .m_Desc.BindFlags >> 7;
    }
  }
  UVar3 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage;
  Args_1 = (char (*) [56])(ulong)UVar3;
  if (UVar3 == USAGE_DYNAMIC) {
    if (bVar9 == 0) {
      if (VStack_184 != VK_SHARING_MODE_EXCLUSIVE) {
        FormatString<char[91]>
                  ((string *)local_248,
                   (char (*) [91])
                   "Sharing mode is not supported for dynamic buffers, must be handled by ValidateBufferDesc()"
                  );
        Args_1 = (char (*) [56])0xc5;
        DebugAssertionFailed
                  ((Char *)local_248._0_8_,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0xc5);
        if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
          operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
        }
      }
      (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_GENERIC_READ;
      VVar12 = ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE_GENERIC_READ);
      if (VVar12 != 0x82f) {
        FormatString<char[26],char[56]>
                  ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ResourceStateFlagsToVkAccessFlags(State) == AccessFlags",Args_1);
        Args_1 = (char (*) [56])0xdb;
        DebugAssertionFailed
                  ((Char *)local_248._0_8_,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0xdb);
        if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
          operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
        }
      }
      (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties =
           MEMORY_PROPERTY_HOST_COHERENT;
      if ((this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State == RESOURCE_STATE_UNKNOWN)
      {
        FormatString<char[26],char[17]>
                  ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"IsInKnownState()",(char (*) [17])Args_1);
        DebugAssertionFailed
                  ((Char *)local_248._0_8_,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x1bd);
        if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
          operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
        }
      }
      goto LAB_002783bc;
    }
    uVar16 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.ImmediateContextMask;
    if ((uVar16 & uVar16 - 1) != 0) {
      FormatString<char[108]>
                ((string *)local_248,
                 (char (*) [108])
                 "ImmediateContextMask must contain single set bit, this error should\'ve been handled in ValidateBufferDesc()"
                );
      DebugAssertionFailed
                ((Char *)local_248._0_8_,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0xe4);
      if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
        operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
      }
    }
  }
  else if (UVar3 == USAGE_SPARSE) {
    local_198 = (_Base_ptr)
                CONCAT44(local_198._4_4_,
                         ((this->super_BufferBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          .m_Desc.MiscFlags & 1) * 4 + 3);
    VulkanUtilities::VulkanLogicalDevice::CreateBuffer
              ((BufferWrapper *)local_248,local_160,(VkBufferCreateInfo *)&local_1a8,
               (this->super_BufferBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    operator=((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_158
              ,(VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
               local_248);
    VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
    ~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
               local_248);
    (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_UNDEFINED;
    goto LAB_002783bc;
  }
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)local_248,peVar8,(VkBufferCreateInfo *)&local_1a8,
             ((DeviceObjectAttribs *)auStack_238._136_8_)->Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_158,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_248);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)local_248)
  ;
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&local_110,peVar8,(this->m_VulkanBuffer).m_VkObject);
  UVar3 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
          .m_Desc.Usage;
  uVar18 = 1;
  if (UVar3 < USAGE_STAGING) {
LAB_0027779a:
    local_24c = VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                          (this_00,local_110.memoryTypeBits,uVar18);
  }
  else {
    if (1 < UVar3 - 3) {
      FormatString<char[17]>((string *)local_248,(char (*) [17])"Unexpected usage");
      DebugAssertionFailed
                ((Char *)local_248._0_8_,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x10c);
      if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
        operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
      }
      uVar18 = 0;
      goto LAB_0027779a;
    }
    uVar20 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             .m_Desc.CPUAccessFlags & 1;
    uVar18 = (uint)(UVar3 == USAGE_UNIFIED) + uVar20 * 8 + 6;
    local_24c = VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                          (this_00,local_110.memoryTypeBits,uVar18);
    if (local_24c == 0xffffffff) {
      uVar18 = (uint)(UVar3 == USAGE_UNIFIED) + uVar20 * 8 + 2;
      goto LAB_0027779a;
    }
  }
  if ((uVar18 & 4) != 0) {
    pMVar1 = &(this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties;
    *(undefined1 *)pMVar1 = (char)*pMVar1 | MEMORY_PROPERTY_HOST_COHERENT;
  }
  uVar18 = (uint)uStack_186;
  if (local_24c == 0xffffffff) {
    local_248[0] = 0x27;
    pcVar19 = "Failed to find suitable memory type for buffer \'";
    LogError<true,char[49],char_const*,char>
              (false,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x11a,(char (*) [49])"Failed to find suitable memory type for buffer \'",
               (char **)auStack_238._136_8_,(char *)local_248);
  }
  Alignment = (char (*) [43])local_110.alignment;
  if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.BindFlags & BIND_RAY_TRACING) != BIND_NONE) {
    uVar20 = *(uint32_t *)((long)&(this_00->m_ExtProperties).AccelStruct + 0x38);
    Alignment = (char (*) [43])0x10;
    if (0x10 < uVar20) {
      Alignment = (char (*) [43])(ulong)uVar20;
    }
    if (Alignment < local_110.alignment) {
      Alignment = (char (*) [43])local_110.alignment;
    }
    if ((ulong)Alignment % local_110.alignment != 0) {
      FormatString<char[26],char[43]>
                ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"RequiredAlignment % MemReqs.alignment == 0",
                 (char (*) [43])local_110.alignment);
      DebugAssertionFailed
                ((Char *)local_248._0_8_,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x126);
      if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
        operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
      }
    }
  }
  if ((((this->super_BufferBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
        .m_Desc.CPUAccessFlags & (CPU_ACCESS_FLAG_LAST|CPU_ACCESS_READ)) == CPU_ACCESS_NONE) ||
     (((this->super_BufferBase<Diligent::EngineVkImplTraits>).m_MemoryProperties &
      MEMORY_PROPERTY_HOST_COHERENT) != MEMORY_PROPERTY_UNKNOWN)) {
    bVar23 = false;
  }
  else {
    local_98._0_8_ = *(VkDeviceSize *)((long)&(this_00->m_Properties).limits + 0x1f0);
    if (Alignment <= (ulong)local_98._0_8_) {
      Alignment = (char (*) [43])local_98._0_8_;
    }
    if ((char *)(local_98._0_8_ ^ (ulong)(*(char (*) [43])(local_98._0_8_ + -0x2b) + 0x2a)) <=
        *(char (*) [43])(local_98._0_8_ + -0x2b) + 0x2a) {
      FormatString<char[12],unsigned_long,char[23]>
                ((string *)local_248,(Diligent *)"Alignment (",(char (*) [12])&local_98,
                 (unsigned_long *)") must be a power of 2",(char (*) [23])pcVar19);
      DebugAssertionFailed
                ((Char *)local_248._0_8_,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
        operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
      }
    }
    local_110.size =
         -local_98._0_8_ & (ulong)(*(char (*) [43])(local_98._0_8_ + -0x2b) + local_110.size + 0x2a)
    ;
    bVar23 = true;
  }
  uVar16 = (long)Alignment - ((ulong)Alignment >> 1 & 0x5555555555555555);
  uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
  uVar16 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar16 >> 0x38 != 1) {
    FormatString<char[29]>((string *)local_248,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)local_248._0_8_,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x135);
    if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
      operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
    }
  }
  pcVar19 = (char *)(ulong)local_24c;
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)local_248,local_118,local_110.size,(VkDeviceSize)Alignment,
             local_24c,uVar18 & 2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)local_248._0_8_;
  (this->m_MemoryAllocation).UnalignedOffset = local_248._8_8_;
  (this->m_MemoryAllocation).Size = auStack_238._0_8_;
  local_248._0_8_ = (VulkanMemoryPage *)0x0;
  local_248._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  auStack_238._0_8_ = 0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)local_248);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    pcVar19 = "Failed to allocate memory for buffer \'";
    LogError<true,char[39],char_const*,char[3]>
              (false,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x138,(char (*) [39])"Failed to allocate memory for buffer \'",
               (char **)auStack_238._136_8_,(char (*) [3])"\'.");
  }
  VVar4 = (this->m_MemoryAllocation).UnalignedOffset;
  VVar14 = VVar4;
  local_98._0_8_ = Alignment;
  if ((char)(uVar16 >> 0x38) != '\x01') {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)local_248,(Diligent *)"Alignment (",(char (*) [12])&local_98,
               (unsigned_long *)") must be a power of 2",(char (*) [23])pcVar19);
    DebugAssertionFailed
              ((Char *)local_248._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
      operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
    }
    VVar14 = (this->m_MemoryAllocation).UnalignedOffset;
  }
  pBVar7 = local_168;
  pVVar2 = &this->m_BufferMemoryAlignedOffset;
  Args_1_02 = (char (*) [46])
              (-local_98._0_8_ & (ulong)(*(char (*) [43])(local_98._0_8_ + -0x2b) + VVar4 + 0x2a));
  this->m_BufferMemoryAlignedOffset = (VkDeviceSize)Args_1_02;
  if ((this->m_MemoryAllocation).Size < (long)Args_1_02 + (local_110.size - VVar14)) {
    FormatString<char[39]>
              ((string *)local_248,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)local_248._0_8_,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x13b);
    if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
      operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
    }
    Args_1_02 = (char (*) [46])*pVVar2;
  }
  VVar10 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                     (local_160,(this->m_VulkanBuffer).m_VkObject,
                      (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,
                      (VkDeviceSize)Args_1_02);
  if (VVar10 != VK_SUCCESS) {
    local_248._0_8_ = VulkanUtilities::VkResultToString(VVar10);
    Args_1_02 = (char (*) [46])0x13e;
    LogError<true,char[29],char[17],char_const*>
              (false,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x13e,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)local_248);
  }
  if ((bVar23) &&
     ((local_110.size + *pVVar2) % *(VkDeviceSize *)((long)&(this_00->m_Properties).limits + 0x1f0)
      != 0)) {
    FormatString<char[35]>((string *)local_248,(char (*) [35])"End offset is not properly aligned");
    Args_1_02 = (char (*) [46])0x140;
    DebugAssertionFailed
              ((Char *)local_248._0_8_,"BufferVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
               ,0x140);
    if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
      operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
    }
  }
  if (((this->super_BufferBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
       .m_Desc.BindFlags & BIND_RAY_TRACING) != BIND_NONE) {
    uVar18 = *(uint32_t *)((long)&(this_00->m_ExtProperties).AccelStruct + 0x38);
    VVar15 = GetVkDeviceAddress(this);
    Args_1_02 = (char (*) [46])0x10;
    if (0x10 < uVar18) {
      Args_1_02 = (char (*) [46])(ulong)uVar18;
    }
    if (VVar15 % (ulong)Args_1_02 != 0) {
      FormatString<char[54]>
                ((string *)local_248,
                 (char (*) [54])"Address is not properly aligned for ray tracing usage");
      Args_1_02 = (char (*) [46])0x149;
      DebugAssertionFailed
                ((Char *)local_248._0_8_,"BufferVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                 ,0x149);
      if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
        operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
      }
    }
  }
  RVar22 = RESOURCE_STATE_UNDEFINED;
  if ((pBVar7 != (BufferData *)0x0) && (pBVar7->pData != (void *)0x0)) {
    __n = (_Base_ptr)pBVar7->DataSize;
    if (uStack_190 < (_Base_ptr)pBVar7->DataSize) {
      __n = uStack_190;
    }
    if (__n != (_Base_ptr)0x0) {
      if ((this_00->m_MemoryProperties).memoryTypeCount <= local_24c) {
        FormatString<char[26],char[46]>
                  ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"MemoryTypeIndex < MemoryProps.memoryTypeCount",Args_1_02);
        Args_1_02 = (char (*) [46])0x155;
        DebugAssertionFailed
                  ((Char *)local_248._0_8_,"BufferVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                   ,0x155);
        if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
          operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
        }
      }
      uVar18 = (this_00->m_MemoryProperties).memoryTypes[local_24c].propertyFlags;
      if ((uVar18 & 2) == 0) {
        local_98.sharingMode = VStack_184;
        local_98.queueFamilyIndexCount = uStack_180;
        local_98._44_4_ = uStack_17c;
        local_98.pQueueFamilyIndices = local_178;
        local_98.flags = (VkBufferCreateFlags)local_198;
        local_98._20_4_ = local_198._4_4_;
        local_98.size._0_4_ = (undefined4)uStack_190;
        local_98.size._4_4_ = uStack_190._4_4_;
        local_98._0_8_ = local_1a8;
        local_98.pNext._0_4_ = (_Rb_tree_color)pvStack_1a0;
        local_98.pNext._4_4_ = pvStack_1a0._4_4_;
        local_98.usage = 1;
        local_f8[0] = local_e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"Upload buffer for \'","");
        std::__cxx11::string::append((char *)local_f8);
        pRVar13 = local_118;
        std::__cxx11::string::push_back((char)local_f8);
        peVar8 = local_160;
        VulkanUtilities::VulkanLogicalDevice::CreateBuffer
                  (&local_b0,local_160,&local_98,(char *)local_f8[0]);
        VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
                  (&local_60,peVar8,local_b0.m_VkObject);
        if ((Char *)(local_60.alignment ^ (ulong)(local_60.alignment + -1)) <=
            (Char *)(local_60.alignment + -1)) {
          FormatString<char[29]>((string *)local_248,(char (*) [29])"Alignment is not power of 2!");
          DebugAssertionFailed
                    ((Char *)local_248._0_8_,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x16f);
          if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
            operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
          }
        }
        pcVar19 = (char *)0x0;
        VulkanUtilities::VulkanMemoryManager::Allocate
                  (&local_150,&pRVar13->m_MemoryMgr,&local_60,6,0);
        if (local_150.Page == (VulkanMemoryPage *)0x0) {
          pcVar19 = "Failed to allocate staging memory for buffer \'";
          LogError<true,char[47],char_const*,char[3]>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x176,(char (*) [47])"Failed to allocate staging memory for buffer \'",
                     (char **)auStack_238._136_8_,(char (*) [3])"\'.");
        }
        VVar4 = local_150.UnalignedOffset;
        memory = (VkDeviceMemory)
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_150.Page + 0xf0))->
                 _vptr__Sp_counted_base;
        local_d8._M_dataplus._M_p = (pointer)local_60.alignment;
        if ((Char *)(local_60.alignment ^ (ulong)(local_60.alignment + -1)) <=
            (Char *)(local_60.alignment + -1)) {
          FormatString<char[12],unsigned_long,char[23]>
                    ((string *)local_248,(Diligent *)"Alignment (",(char (*) [12])&local_d8,
                     (unsigned_long *)") must be a power of 2",(char (*) [23])pcVar19);
          DebugAssertionFailed
                    ((Char *)local_248._0_8_,"AlignUp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                     ,0x34);
          if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
            operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
          }
        }
        uVar16 = -(long)local_d8._M_dataplus._M_p &
                 (ulong)(local_d8._M_dataplus._M_p + (long)(VVar4 + -1));
        Args_1_00 = (char (*) [128])(local_60.size + (uVar16 - local_150.UnalignedOffset));
        if (local_150.Size < Args_1_00) {
          FormatString<char[26],char[128]>
                    ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "StagingMemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - StagingMemoryAllocation.UnalignedOffset)"
                     ,Args_1_00);
          DebugAssertionFailed
                    ((Char *)local_248._0_8_,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x17a);
          if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
            operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
          }
        }
        lVar5 = *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)local_150.Page + 0xf0))->_M_use_count;
        if (lVar5 == 0) {
          local_248[0] = 0x27;
          LogError<true,char[45],char_const*,char>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x17e,(char (*) [45])"Failed to allocate staging data for buffer \'",
                     (char **)auStack_238._136_8_,local_248);
        }
        memcpy((void *)(lVar5 + uVar16),local_168->pData,(size_t)__n);
        VVar10 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                           (local_160,local_b0.m_VkObject,memory,uVar16);
        if (VVar10 != VK_SUCCESS) {
          local_248._0_8_ = VulkanUtilities::VkResultToString(VVar10);
          LogError<true,char[37],char[17],char_const*>
                    (false,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x182,(char (*) [37])"Failed to bind staging buffer memory",
                     (char (*) [17])"\nVK Error Code: ",(char **)local_248);
        }
        this_01 = (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *)local_168->pContext;
        if (this_01 == (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *)0x0) {
          uVar16 = (this->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.ImmediateContextMask;
          if (uVar16 == 0) {
            uVar11 = 0x40;
          }
          else {
            lVar5 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar11 = (undefined4)lVar5;
          }
          local_248._0_4_ = uVar11;
          CommandQueueId.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)local_248);
        }
        else {
          CheckDynamicType<Diligent::DeviceContextVkImpl,Diligent::IDeviceContext>
                    ((IDeviceContext *)this_01);
          CommandQueueId =
               DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId(this_01);
        }
        local_48.m_pLogicalDevice.
        super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_48.m_pLogicalDevice.
        super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_48.m_VkObject = (VkCommandPool_T *)0x0;
        VulkanUtilities::VulkanCommandBuffer::VulkanCommandBuffer((VulkanCommandBuffer *)local_248);
        RenderDeviceVkImpl::AllocateTransientCmdPool
                  (pRVar13,CommandQueueId,&local_48,(VulkanCommandBuffer *)local_248,
                   "Transient command pool to copy staging data to a device buffer");
        Args_1_01 = (char (*) [44])0x4000;
        VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
                  ((VulkanCommandBuffer *)local_248,0x4000,0x800,0x4000,0x1000);
        VVar12 = ResourceStateFlagsToVkAccessFlags(RESOURCE_STATE_COPY_DEST);
        if (VVar12 != 0x1000) {
          FormatString<char[26],char[44]>
                    (&local_d8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"AccessFlags == VK_ACCESS_TRANSFER_WRITE_BIT",Args_1_01);
          DebugAssertionFailed
                    (local_d8._M_dataplus._M_p,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,399);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            (ulong)(local_d8.field_2._M_allocated_capacity + 1));
          }
        }
        VulkanUtilities::VulkanCommandBuffer::MemoryBarrier
                  ((VulkanCommandBuffer *)local_248,0,VVar12,0x1000,0x1000);
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity = (size_type)uStack_190;
        VulkanUtilities::VulkanCommandBuffer::CopyBuffer
                  ((VulkanCommandBuffer *)local_248,local_b0.m_VkObject,
                   (this->m_VulkanBuffer).m_VkObject,1,(VkBufferCopy *)&local_d8);
        RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
                  (pRVar13,CommandQueueId,(VkCommandBuffer)local_248._0_8_,&local_48);
        QueueMask = 1L << (CommandQueueId.m_Value & 0x3f);
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
        ::
        SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
                  ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                    *)pRVar13,&local_b0,QueueMask);
        RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
        ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
                  ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                    *)pRVar13,&local_150,QueueMask);
        if ((pointer)auStack_238._112_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_238._112_8_,auStack_238._128_8_ - auStack_238._112_8_);
        }
        VulkanUtilities::
        VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
        ~VulkanObjectWrapper(&local_48);
        VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(&local_150);
        VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
        ~VulkanObjectWrapper(&local_b0);
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],(long)local_e8[0] + 1);
        }
        RVar22 = RESOURCE_STATE_COPY_DEST;
      }
      else {
        pvVar6 = local_120->Page->m_CPUMemory;
        if (pvVar6 == (void *)0x0) {
          FormatString<char[26],char[17]>
                    ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])0x914801,(char (*) [17])Args_1_02);
          DebugAssertionFailed
                    ((Char *)local_248._0_8_,"BufferVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BufferVkImpl.cpp"
                     ,0x15b);
          if ((VulkanMemoryPage *)local_248._0_8_ != (VulkanMemoryPage *)auStack_238) {
            operator_delete((void *)local_248._0_8_,auStack_238._0_8_ + 1);
          }
        }
        memcpy((void *)((long)pvVar6 + *pVVar2),local_168->pData,(size_t)__n);
        if ((uVar18 & 4) == 0) {
          FlushMappedRange(this,0,(this->super_BufferBase<Diligent::EngineVkImplTraits>).
                                  super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                  .m_Desc.Size);
        }
      }
    }
  }
  (this->super_BufferBase<Diligent::EngineVkImplTraits>).m_State = RVar22;
LAB_002783bc:
  if (local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BufferVkImpl::BufferVkImpl(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& BuffViewObjMemAllocator,
                           RenderDeviceVkImpl*        pRenderDeviceVk,
                           const BufferDesc&          BuffDesc,
                           const BufferData*          pBuffData /*= nullptr*/) :
    TBufferBase{
        pRefCounters,
        BuffViewObjMemAllocator,
        pRenderDeviceVk,
        BuffDesc,
        false,
    }
{
    ValidateBufferInitData(m_Desc, pBuffData);

    const VulkanUtilities::VulkanLogicalDevice&  LogicalDevice  = pRenderDeviceVk->GetLogicalDevice();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice = pRenderDeviceVk->GetPhysicalDevice();
    const VkPhysicalDeviceLimits&                DeviceLimits   = PhysicalDevice.GetProperties().limits;

    m_DynamicOffsetAlignment = std::max(Uint32{4}, static_cast<Uint32>(DeviceLimits.optimalBufferCopyOffsetAlignment));

    VkBufferCreateInfo VkBuffCI{};
    VkBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkBuffCI.pNext = nullptr;
    VkBuffCI.flags = 0; // VK_BUFFER_CREATE_SPARSE_BINDING_BIT, VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT, VK_BUFFER_CREATE_SPARSE_ALIASED_BIT
    VkBuffCI.size  = m_Desc.Size;
    VkBuffCI.usage =
        VK_BUFFER_USAGE_TRANSFER_SRC_BIT | // The buffer can be used as the source of a transfer command
        VK_BUFFER_USAGE_TRANSFER_DST_BIT;  // The buffer can be used as the destination of a transfer command

    static_assert(BIND_FLAG_LAST == 0x800, "Please update this function to handle the new bind flags");

    for (BIND_FLAGS BindFlags = m_Desc.BindFlags; BindFlags != 0;)
    {
        BIND_FLAGS BindFlag = ExtractLSB(BindFlags);
        switch (BindFlag)
        {
            case BIND_SHADER_RESOURCE:
            {
                if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
                {
                    // Formatted buffers are mapped to uniform texel buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minTexelBufferOffsetAlignment));
                }
                else
                {
                    // Structured and ByteAddress buffers are mapped to read-only storage buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minStorageBufferOffsetAlignment));
                }

                break;
            }
            case BIND_UNORDERED_ACCESS:
            {
                if (m_Desc.Mode == BUFFER_MODE_FORMATTED)
                {
                    // RW formatted buffers are mapped to storage texel buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT;
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minTexelBufferOffsetAlignment));
                }
                else
                {
                    // RWStructured and RWByteAddress buffers are mapped to storage buffers in Vulkan.
                    VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
                    // Each element of pDynamicOffsets of vkCmdBindDescriptorSets function which corresponds to a descriptor
                    // binding with type VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC must be a multiple of
                    // VkPhysicalDeviceLimits::minStorageBufferOffsetAlignment (13.2.5)
                    m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minStorageBufferOffsetAlignment));
                }

                break;
            }
            case BIND_VERTEX_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_VERTEX_BUFFER_BIT;
                break;
            }
            case BIND_INDEX_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_INDEX_BUFFER_BIT;
                break;
            }
            case BIND_INDIRECT_DRAW_ARGS:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT;
                break;
            }
            case BIND_UNIFORM_BUFFER:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT;

                // Each element of pDynamicOffsets parameter of vkCmdBindDescriptorSets function which corresponds to a descriptor
                // binding with type VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC must be a multiple of
                // VkPhysicalDeviceLimits::minUniformBufferOffsetAlignment (13.2.5)
                m_DynamicOffsetAlignment = std::max(m_DynamicOffsetAlignment, static_cast<Uint32>(DeviceLimits.minUniformBufferOffsetAlignment));
                break;
            }
            case BIND_RAY_TRACING:
            {
                VkBuffCI.usage |= VK_BUFFER_USAGE_STORAGE_BUFFER_BIT; // for scratch buffer
                VkBuffCI.usage |= VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
                VkBuffCI.usage |= VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_BUILD_INPUT_READ_ONLY_BIT_KHR; // acceleration structure build inputs such as vertex, index, transform, aabb, and instance data
                VkBuffCI.usage |= VK_BUFFER_USAGE_SHADER_BINDING_TABLE_BIT_KHR;
                break;
            }
            default:
                UNEXPECTED("unsupported buffer binding type");
                break;
        }
    }

    VkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE; // Sharing mode of the buffer when it is accessed by multiple queue families.
    VkBuffCI.queueFamilyIndexCount = 0;                         // The number of entries in the pQueueFamilyIndices array.
    VkBuffCI.pQueueFamilyIndices   = nullptr;                   // The list of queue families that will access this buffer
                                                                // (ignored if sharingMode is not VK_SHARING_MODE_CONCURRENT).

    const std::vector<uint32_t> QueueFamilyIndices = PlatformMisc::CountOneBits(m_Desc.ImmediateContextMask) > 1 ?
        GetDevice()->ConvertCmdQueueIdsToQueueFamilies(m_Desc.ImmediateContextMask) :
        std::vector<uint32_t>{};
    if (QueueFamilyIndices.size() > 1)
    {
        // If sharingMode is VK_SHARING_MODE_CONCURRENT, queueFamilyIndexCount must be greater than 1
        VkBuffCI.sharingMode           = VK_SHARING_MODE_CONCURRENT;
        VkBuffCI.pQueueFamilyIndices   = QueueFamilyIndices.data();
        VkBuffCI.queueFamilyIndexCount = static_cast<uint32_t>(QueueFamilyIndices.size());
    }

    constexpr VkBufferUsageFlags UsageThatRequiresBackingBuffer =
        VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT |
        VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT |
        VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;

    const bool RequiresBackingBuffer =
        (VkBuffCI.usage & UsageThatRequiresBackingBuffer) != 0 ||
        // We only need a backing buffer for the storage buffer if there is an unordered access bind flag (aka RW structured buffers).
        // Read-only storage buffers (aka structured buffers) don't need a backing buffer.
        ((VkBuffCI.usage & VK_BUFFER_USAGE_STORAGE_BUFFER_BIT) != 0 && (m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != 0);

    if (m_Desc.Usage == USAGE_SPARSE)
    {
        VkBuffCI.flags =
            VK_BUFFER_CREATE_SPARSE_BINDING_BIT |
            VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT |
            (m_Desc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING ? VK_BUFFER_CREATE_SPARSE_ALIASED_BIT : 0);

        m_VulkanBuffer = LogicalDevice.CreateBuffer(VkBuffCI, m_Desc.Name);

        SetState(RESOURCE_STATE_UNDEFINED);
    }
    else if (m_Desc.Usage == USAGE_DYNAMIC && !RequiresBackingBuffer)
    {
        VERIFY(VkBuffCI.sharingMode == VK_SHARING_MODE_EXCLUSIVE,
               "Sharing mode is not supported for dynamic buffers, must be handled by ValidateBufferDesc()");

        // Dynamic constant/vertex/index/structured buffers are suballocated in the upload heap when Map() is called.
        // Dynamic formatted buffers or writable buffers need to be allocated in GPU-local memory.
        constexpr RESOURCE_STATE State = static_cast<RESOURCE_STATE>(
            RESOURCE_STATE_VERTEX_BUFFER |
            RESOURCE_STATE_INDEX_BUFFER |
            RESOURCE_STATE_CONSTANT_BUFFER |
            RESOURCE_STATE_SHADER_RESOURCE |
            RESOURCE_STATE_COPY_SOURCE |
            RESOURCE_STATE_INDIRECT_ARGUMENT);
        SetState(State);

#ifdef DILIGENT_DEBUG
        {
            constexpr VkAccessFlags AccessFlags =
                VK_ACCESS_INDIRECT_COMMAND_READ_BIT |
                VK_ACCESS_INDEX_READ_BIT |
                VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT |
                VK_ACCESS_UNIFORM_READ_BIT |
                VK_ACCESS_SHADER_READ_BIT |
                VK_ACCESS_TRANSFER_READ_BIT;
            VERIFY_EXPR(ResourceStateFlagsToVkAccessFlags(State) == AccessFlags);
        }
#endif
        // Dynamic buffer memory is always host-coherent
        m_MemoryProperties = MEMORY_PROPERTY_HOST_COHERENT;
    }
    else
    {
        VERIFY(m_Desc.Usage != USAGE_DYNAMIC || PlatformMisc::CountOneBits(m_Desc.ImmediateContextMask) <= 1,
               "ImmediateContextMask must contain single set bit, this error should've been handled in ValidateBufferDesc()");

        m_VulkanBuffer = LogicalDevice.CreateBuffer(VkBuffCI, m_Desc.Name);

        VkMemoryRequirements MemReqs = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);

        static constexpr uint32_t InvalidMemoryTypeIndex = VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex;

        uint32_t MemoryTypeIndex = InvalidMemoryTypeIndex;
        {
            VkMemoryPropertyFlags vkMemoryFlags = 0;
            switch (m_Desc.Usage)
            {
                case USAGE_IMMUTABLE:
                case USAGE_DEFAULT:
                case USAGE_DYNAMIC: // Dynamic buffer with SRV or UAV bind flag
                    vkMemoryFlags = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT;
                    break;

                case USAGE_UNIFIED:
                case USAGE_STAGING:
                    vkMemoryFlags = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;

                    if (m_Desc.Usage == USAGE_UNIFIED)
                        vkMemoryFlags |= VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT;

                    if ((m_Desc.CPUAccessFlags & CPU_ACCESS_READ) != 0)
                        vkMemoryFlags |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;

                    // Try to find coherent memory first
                    vkMemoryFlags |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
                    MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, vkMemoryFlags);
                    if (MemoryTypeIndex == InvalidMemoryTypeIndex)
                    {
                        // Use non-coherent memory
                        vkMemoryFlags &= ~VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
                    }
                    break;

                default:
                    UNEXPECTED("Unexpected usage");
            }
            if (MemoryTypeIndex == InvalidMemoryTypeIndex)
                MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, vkMemoryFlags);

            if (vkMemoryFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT)
                m_MemoryProperties |= MEMORY_PROPERTY_HOST_COHERENT;
        }

        VkMemoryAllocateFlags AllocateFlags = 0;
        if (VkBuffCI.usage & VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT)
            AllocateFlags = VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT;

        if (MemoryTypeIndex == InvalidMemoryTypeIndex)
            LOG_ERROR_AND_THROW("Failed to find suitable memory type for buffer '", m_Desc.Name, '\'');

        VkDeviceSize RequiredAlignment = MemReqs.alignment;
        if ((m_Desc.BindFlags & BIND_RAY_TRACING) != 0)
        {
            // geometry.triangles.vertexData.deviceAddress must be aligned to the size in bytes of the smallest component of the format in vertexFormat (which is 4 bytes).
            // geometry.triangles.indexData.deviceAddress must be aligned to the size in bytes of the type in indexType (which is 4 bytes).
            // if geometry.triangles.transformData.deviceAddress is not 0, it must be aligned to 16 bytes.
            // geometry.aabbs.data.deviceAddress must be aligned to 8 bytes.
            const VkDeviceSize ReadOnlyRTBufferAlign = 16u;
            const VkDeviceSize ScratchBufferAlign    = PhysicalDevice.GetExtProperties().AccelStruct.minAccelerationStructureScratchOffsetAlignment;
            RequiredAlignment                        = std::max(RequiredAlignment, std::max(ScratchBufferAlign, ReadOnlyRTBufferAlign));
            VERIFY_EXPR(RequiredAlignment % MemReqs.alignment == 0);
        }

        const bool AlignToNonCoherentAtomSize = (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) != 0 && (m_MemoryProperties & MEMORY_PROPERTY_HOST_COHERENT) == 0;
        if (AlignToNonCoherentAtomSize)
        {
            // From specs:
            //  If the device memory was allocated without the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT set,
            //  these guarantees must be made for an extended range: the application must round down the start
            //  of the range to the nearest multiple of VkPhysicalDeviceLimits::nonCoherentAtomSize,
            //  and round the end of the range up to the nearest multiple of VkPhysicalDeviceLimits::nonCoherentAtomSize.
            RequiredAlignment = std::max(RequiredAlignment, DeviceLimits.nonCoherentAtomSize);
            MemReqs.size      = AlignUp(MemReqs.size, DeviceLimits.nonCoherentAtomSize);
        }

        VERIFY(IsPowerOfTwo(RequiredAlignment), "Alignment is not power of 2!");
        m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, RequiredAlignment, MemoryTypeIndex, AllocateFlags);
        if (!m_MemoryAllocation)
            LOG_ERROR_AND_THROW("Failed to allocate memory for buffer '", m_Desc.Name, "'.");

        m_BufferMemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, RequiredAlignment);
        VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_BufferMemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
        VkDeviceMemory Memory = m_MemoryAllocation.Page->GetVkMemory();
        VkResult       err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_BufferMemoryAlignedOffset);
        CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

        VERIFY(!AlignToNonCoherentAtomSize || (m_BufferMemoryAlignedOffset + MemReqs.size) % DeviceLimits.nonCoherentAtomSize == 0, "End offset is not properly aligned");

#ifdef DILIGENT_DEBUG
        if ((m_Desc.BindFlags & BIND_RAY_TRACING) != 0)
        {
            const VkDeviceSize    ReadOnlyRTBufferAlign = 16u;
            const VkDeviceSize    ScratchBufferAlign    = PhysicalDevice.GetExtProperties().AccelStruct.minAccelerationStructureScratchOffsetAlignment;
            const VkDeviceSize    MinRTBufferAlign      = std::max(ScratchBufferAlign, ReadOnlyRTBufferAlign);
            const VkDeviceAddress DeviceAddress         = GetVkDeviceAddress();
            VERIFY(DeviceAddress % MinRTBufferAlign == 0, "Address is not properly aligned for ray tracing usage");
        }
#endif

        const Uint64 InitialDataSize = (pBuffData != nullptr && pBuffData->pData != nullptr) ?
            std::min(pBuffData->DataSize, VkBuffCI.size) :
            0;

        RESOURCE_STATE InitialState = RESOURCE_STATE_UNDEFINED;
        if (InitialDataSize > 0)
        {
            const VkPhysicalDeviceMemoryProperties& MemoryProps = PhysicalDevice.GetMemoryProperties();
            VERIFY_EXPR(MemoryTypeIndex < MemoryProps.memoryTypeCount);
            const VkMemoryPropertyFlags MemoryPropFlags = MemoryProps.memoryTypes[MemoryTypeIndex].propertyFlags;
            if ((MemoryPropFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) != 0)
            {
                // Memory is directly accessible by CPU
                uint8_t* pData = reinterpret_cast<uint8_t*>(m_MemoryAllocation.Page->GetCPUMemory());
                VERIFY_EXPR(pData != nullptr);
                memcpy(pData + m_BufferMemoryAlignedOffset, pBuffData->pData, StaticCast<size_t>(InitialDataSize));

                if ((MemoryPropFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT) == 0)
                {
                    // Explicit flush is required
                    FlushMappedRange(0, m_Desc.Size);
                }
            }
            else
            {
                VkBufferCreateInfo VkStaginBuffCI = VkBuffCI;
                VkStaginBuffCI.usage              = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;

                std::string StagingBufferName = "Upload buffer for '";
                StagingBufferName += m_Desc.Name;
                StagingBufferName += '\'';
                VulkanUtilities::BufferWrapper StagingBuffer = LogicalDevice.CreateBuffer(VkStaginBuffCI, StagingBufferName.c_str());

                VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(StagingBuffer);
                VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

                // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
                // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
                // to the host (10.2)
                VulkanUtilities::VulkanMemoryAllocation StagingMemoryAllocation = pRenderDeviceVk->AllocateMemory(StagingBufferMemReqs, VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);
                if (!StagingMemoryAllocation)
                    LOG_ERROR_AND_THROW("Failed to allocate staging memory for buffer '", m_Desc.Name, "'.");

                VkDeviceMemory StagingBufferMemory     = StagingMemoryAllocation.Page->GetVkMemory();
                VkDeviceSize   AlignedStagingMemOffset = AlignUp(VkDeviceSize{StagingMemoryAllocation.UnalignedOffset}, StagingBufferMemReqs.alignment);
                VERIFY_EXPR(StagingMemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - StagingMemoryAllocation.UnalignedOffset));

                uint8_t* StagingData = reinterpret_cast<uint8_t*>(StagingMemoryAllocation.Page->GetCPUMemory());
                if (StagingData == nullptr)
                    LOG_ERROR_AND_THROW("Failed to allocate staging data for buffer '", m_Desc.Name, '\'');
                memcpy(StagingData + AlignedStagingMemOffset, pBuffData->pData, StaticCast<size_t>(InitialDataSize));

                err = LogicalDevice.BindBufferMemory(StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
                CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

                const SoftwareQueueIndex CmdQueueInd = pBuffData->pContext ?
                    ClassPtrCast<DeviceContextVkImpl>(pBuffData->pContext)->GetCommandQueueId() :
                    SoftwareQueueIndex{PlatformMisc::GetLSB(m_Desc.ImmediateContextMask)};

                VulkanUtilities::CommandPoolWrapper  CmdPool;
                VulkanUtilities::VulkanCommandBuffer CmdBuffer;
                pRenderDeviceVk->AllocateTransientCmdPool(CmdQueueInd, CmdPool, CmdBuffer, "Transient command pool to copy staging data to a device buffer");

                CmdBuffer.MemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT);
                InitialState              = RESOURCE_STATE_COPY_DEST;
                VkAccessFlags AccessFlags = ResourceStateFlagsToVkAccessFlags(InitialState);
                VERIFY_EXPR(AccessFlags == VK_ACCESS_TRANSFER_WRITE_BIT);
                CmdBuffer.MemoryBarrier(0, AccessFlags, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT);

                // Copy commands MUST be recorded outside of a render pass instance. This is OK here
                // as copy will be the only command in the cmd buffer
                VkBufferCopy BuffCopy{};
                BuffCopy.srcOffset = 0;
                BuffCopy.dstOffset = 0;
                BuffCopy.size      = VkBuffCI.size;
                CmdBuffer.CopyBuffer(StagingBuffer, m_VulkanBuffer, 1, &BuffCopy);

                pRenderDeviceVk->ExecuteAndDisposeTransientCmdBuff(CmdQueueInd, CmdBuffer.GetVkCmdBuffer(), std::move(CmdPool));


                // After command buffer is submitted, safe-release staging resources. This strategy
                // is little overconservative as the resources will only be released after the
                // first command buffer submitted through the immediate context is complete

                // Next Cmd Buff| Next Fence |               This Thread                      |           Immediate Context
                //              |            |                                                |
                //      N       |     F      |                                                |
                //              |            |                                                |
                //              |            |  ExecuteAndDisposeTransientCmdBuff(vkCmdBuff)  |
                //              |            |  - SubmittedCmdBuffNumber = N                  |
                //              |            |  - SubmittedFenceValue = F                     |
                //     N+1 -  - | -  F+1  -  |                                                |
                //              |            |  Release(StagingBuffer)                        |
                //              |            |  - {N+1, StagingBuffer} -> Stale Objects       |
                //              |            |                                                |
                //              |            |                                                |
                //              |            |                                                | ExecuteCommandBuffer()
                //              |            |                                                | - SubmittedCmdBuffNumber = N+1
                //              |            |                                                | - SubmittedFenceValue = F+1
                //     N+2 -  - | -  F+2  -  |  -   -   -   -   -   -   -   -   -   -   -   - |
                //              |            |                                                | - DiscardStaleVkObjects(N+1, F+1)
                //              |            |                                                |   - {F+1, StagingBuffer} -> Release Queue
                //              |            |                                                |

                pRenderDeviceVk->SafeReleaseDeviceObject(std::move(StagingBuffer), Uint64{1} << Uint64{CmdQueueInd});
                pRenderDeviceVk->SafeReleaseDeviceObject(std::move(StagingMemoryAllocation), Uint64{1} << Uint64{CmdQueueInd});
            }
        }

        SetState(InitialState);
    }

    VERIFY_EXPR(IsInKnownState());
}